

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O3

void CheckRows(TidyDocImpl *doc,Node *node)

{
  int *piVar1;
  Node *pNVar2;
  Bool BVar3;
  ctmbstr ptVar4;
  uint uVar5;
  uint uVar6;
  ctmbstr cp;
  
  piVar1 = &(doc->access).CheckedHeaders;
  *piVar1 = *piVar1 + 1;
  if (node == (Node *)0x0) {
    uVar5 = 0;
    uVar6 = 0;
  }
  else {
    uVar5 = 0;
    uVar6 = 0;
    do {
      pNVar2 = node->content;
      if (((pNVar2 != (Node *)0x0) && (pNVar2->tag != (Dict *)0x0)) &&
         (pNVar2->tag->id == TidyTag_TH)) {
        (doc->access).HasTH = yes;
        BVar3 = prvTidynodeIsText(pNVar2->content);
        if (BVar3 != no) {
          ptVar4 = textFromOneNode(doc,node->content->content);
          do {
            if (*ptVar4 == '\0') goto LAB_00155bc9;
            BVar3 = prvTidyIsWhite((int)*ptVar4);
            ptVar4 = ptVar4 + 1;
          } while (BVar3 != no);
          uVar5 = uVar5 + 1;
        }
      }
LAB_00155bc9:
      uVar6 = uVar6 + 1;
      node = node->next;
    } while (node != (Node *)0x0);
    if (uVar6 != uVar5) goto LAB_00155beb;
  }
  (doc->access).HasValidRowHeaders = yes;
LAB_00155beb:
  if (((1 < uVar6) && (1 < (int)uVar5 && (int)uVar5 < (int)uVar6)) && ((doc->access).HasTH == yes))
  {
    (doc->access).HasInvalidRowHeader = yes;
  }
  return;
}

Assistant:

static void CheckRows( TidyDocImpl* doc, Node* node )
{
    int numTR = 0;
    int numValidTH = 0;
    
    doc->access.CheckedHeaders++;

    for (; node != NULL; node = node->next )
    {
        numTR++;
        if ( nodeIsTH(node->content) )
        {
            doc->access.HasTH = yes;            
            if ( TY_(nodeIsText)(node->content->content) )
            {
                ctmbstr word = textFromOneNode( doc, node->content->content);
                if ( !IsWhitespace(word) )
                    numValidTH++;
            }
        }
    }

    if (numTR == numValidTH)
        doc->access.HasValidRowHeaders = yes;

    if ( numTR >= 2 &&
         numTR > numValidTH &&
         numValidTH >= 2 &&
         doc->access.HasTH == yes )
        doc->access.HasInvalidRowHeader = yes;
}